

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::internal::ThousandsSep::operator()(ThousandsSep *this,wchar_t **buffer)

{
  uint uVar1;
  size_t sVar2;
  char *__last;
  char *pcVar3;
  long *in_RSI;
  BasicStringRef<char> *in_RDI;
  wchar_t *ptr;
  
  uVar1 = *(int *)&in_RDI[1].data_ + 1;
  *(uint *)&in_RDI[1].data_ = uVar1;
  if (uVar1 % 3 == 0) {
    sVar2 = BasicStringRef<char>::size(in_RDI);
    *in_RSI = *in_RSI + sVar2 * -4;
    __last = BasicStringRef<char>::data(in_RDI);
    pcVar3 = BasicStringRef<char>::data(in_RDI);
    sVar2 = BasicStringRef<char>::size(in_RDI);
    pcVar3 = pcVar3 + sVar2;
    ptr = (wchar_t *)*in_RSI;
    sVar2 = BasicStringRef<char>::size(in_RDI);
    make_ptr<wchar_t>(ptr,sVar2);
    std::uninitialized_copy<char_const*,wchar_t*>(pcVar3,__last,ptr);
  }
  return;
}

Assistant:

void operator()(Char *&buffer) {
    if (++digit_index_ % 3 != 0)
      return;
    buffer -= sep_.size();
    std::uninitialized_copy(sep_.data(), sep_.data() + sep_.size(),
                            internal::make_ptr(buffer, sep_.size()));
  }